

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ID.cpp
# Opt level: O0

void __thiscall ID_table_t::erase(ID_table_t *this,string *id_name)

{
  bool bVar1;
  __type _Var2;
  Exception *this_00;
  const_iterator local_50;
  undefined1 local_48 [32];
  __normal_iterator<ID_*,_std::vector<ID,_std::allocator<ID>_>_> local_28;
  iterator end;
  iterator ptr;
  string *id_name_local;
  ID_table_t *this_local;
  
  end = std::vector<ID,_std::allocator<ID>_>::begin(&this->table);
  local_28._M_current = (ID *)std::vector<ID,_std::allocator<ID>_>::end(&this->table);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_28);
    if (!bVar1) {
      this_00 = (Exception *)__cxa_allocate_exception(0x30);
      Exception::Exception(this_00,"Scanner error: identifier not found: ",id_name);
      __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
    }
    __gnu_cxx::__normal_iterator<ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator->(&end);
    ID::get_name_abi_cxx11_((ID *)local_48);
    _Var2 = std::operator==(id_name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    if (_Var2) break;
    __gnu_cxx::__normal_iterator<ID_*,_std::vector<ID,_std::allocator<ID>_>_>::operator++(&end);
  }
  __gnu_cxx::__normal_iterator<ID_const*,std::vector<ID,std::allocator<ID>>>::__normal_iterator<ID*>
            ((__normal_iterator<ID_const*,std::vector<ID,std::allocator<ID>>> *)&local_50,&end);
  std::vector<ID,_std::allocator<ID>_>::erase(&this->table,local_50);
  return;
}

Assistant:

void ID_table_t::erase(const string& id_name){
    vector<ID>::iterator ptr = table.begin();
    vector<ID>::iterator end  = table.end();

    while(ptr != end){
        if(id_name == ptr->get_name()){
            table.erase(ptr);
            return;
        }
        ++ptr;
    }
    throw Exception("Scanner error: identifier not found: ", id_name);
}